

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fSyncTests.cpp
# Opt level: O1

void __thiscall deqp::gles3::Functional::FenceSyncCase::deinit(FenceSyncCase *this)

{
  ShaderProgram *this_00;
  
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
    operator_delete(this_00,0xd0);
    this->m_program = (ShaderProgram *)0x0;
  }
  if (this->m_syncObject != (GLsync)0x0) {
    glu::CallLogWrapper::glDeleteSync(&this->super_CallLogWrapper,this->m_syncObject);
    this->m_syncObject = (GLsync)0x0;
  }
  return;
}

Assistant:

void FenceSyncCase::deinit (void)
{
	if (m_program)
	{
		delete m_program;
		m_program = DE_NULL;
	}

	if (m_syncObject)
	{
		glDeleteSync(m_syncObject);
		m_syncObject = DE_NULL;
	}
}